

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::TraitExpr::toString_abi_cxx11_(string *__return_storage_ptr__,TraitExpr *this)

{
  bool bVar1;
  bool bVar2;
  type caps;
  Token *pTVar3;
  Lexer *pLVar4;
  pointer pEVar5;
  pointer this_00;
  string local_108;
  reference local_e8;
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *func;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *__range1;
  reference local_a8;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *impltrait;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  *__range2;
  string local_80 [7];
  bool first;
  string local_60;
  string local_40;
  undefined1 local_19;
  TraitExpr *local_18;
  TraitExpr *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (TraitExpr *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->super_Capable);
  if (bVar1) {
    caps = std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::
           operator*(&(this->super_Capable).caps);
    _capsToString_abi_cxx11_(&local_40,caps);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"trait");
  bVar1 = std::
          vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
          ::empty(&this->templs);
  if (!bVar1) {
    _templateToString_abi_cxx11_(&local_60,&this->templs);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
  pTVar3 = getIdentifier(this);
  pLVar4 = Expr::getLexer(&this->super_Expr);
  (*pTVar3->_vptr_Token[2])(local_80,pTVar3,pLVar4);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_80);
  std::__cxx11::string::~string(local_80);
  bVar1 = std::
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::empty(&this->impltraits);
  if (!bVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,": ");
    bVar1 = true;
    __end2 = std::
             vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ::begin(&this->impltraits);
    impltrait = (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                std::
                vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                ::end(&this->impltraits);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                                       *)&impltrait), bVar2) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                 ::operator*(&__end2);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      }
      pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         (local_a8);
      (*pEVar5->_vptr_Expr[2])();
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&__range1);
      std::__cxx11::string::~string((string *)&__range1);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
  __end1 = std::__cxx11::
           list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
           ::begin(&this->functions);
  func = (unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
         std::__cxx11::
         list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
         ::end(&this->functions);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&func), bVar1) {
    local_e8 = std::
               _List_const_iterator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>
               ::operator*(&__end1);
    this_00 = std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::
              operator->(local_e8);
    FuncExpr::toString_abi_cxx11_(&local_108,this_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    std::
    _List_const_iterator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,';');
  return __return_storage_ptr__;
}

Assistant:

std::string TraitExpr::toString() const noexcept {
  std::string result;
  if (caps)
    result += _capsToString(*caps);

  result += "trait";
  if (!templs.empty()) {
    result += _templateToString(templs);
  }

  result += ' ';
  result += getIdentifier().toString(getLexer());

  if (!impltraits.empty()) {
    result += ": ";
    bool first = true;
    for (auto &impltrait : impltraits) {
      if (!first)
        result += ", ";
      else
        first = false;

      result += impltrait->toString();
    }
  }

  result += '\n';
  for (auto &func : functions) {
    result += func->toString();
    result += '\n';
  }

  result += ';';

  return result;
}